

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

CURLcode tunnel_reinit(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts)

{
  byte *pbVar1;
  CURLcode extraout_EAX;
  
  Curl_dyn_reset((dynbuf *)&cf[2].sockindex);
  Curl_dyn_reset((dynbuf *)&cf[3].conn);
  *(undefined4 *)&cf[7].cft = 0;
  *(undefined4 *)&cf[6].conn = 1;
  *(undefined8 *)&cf[6].sockindex = 0;
  pbVar1 = (byte *)((long)&cf[7].cft + 4);
  *pbVar1 = *pbVar1 & 0xfd;
  return extraout_EAX;
}

Assistant:

static CURLcode tunnel_reinit(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              struct h1_tunnel_state *ts)
{
  (void)data;
  (void)cf;
  DEBUGASSERT(ts);
  Curl_dyn_reset(&ts->rcvbuf);
  Curl_dyn_reset(&ts->request_data);
  ts->tunnel_state = H1_TUNNEL_INIT;
  ts->keepon = KEEPON_CONNECT;
  ts->cl = 0;
  ts->close_connection = FALSE;
  return CURLE_OK;
}